

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

int binbuf_getpos(_binbuf *b,int *x0,int *y0,t_symbol **type)

{
  t_atomtype *ptVar1;
  int iVar2;
  t_atom *a;
  t_symbol *ptVar3;
  t_symbol *ptVar4;
  int iVar5;
  t_atom *ptVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  t_atom *ptVar10;
  bool bVar11;
  t_float tVar12;
  int local_50;
  
  a = binbuf_getvec(b);
  iVar2 = binbuf_getnatom(b);
  if (iVar2 < 3) {
    return 0;
  }
  ptVar3 = atom_getsymbol(a);
  iVar8 = iVar2;
  if (ptVar3 == &s__N) {
    ptVar3 = atom_getsymbol(a + 1);
    ptVar4 = gensym("canvas");
    if (ptVar3 == ptVar4) {
      iVar9 = 0;
      local_50 = 0;
      ptVar10 = a;
      iVar5 = iVar2;
      do {
        iVar7 = -1;
        ptVar6 = ptVar10;
        do {
          ptVar6 = ptVar6 + 1;
          if (iVar7 + iVar5 == -1) {
            iVar7 = iVar5;
            if (iVar5 == 0) goto LAB_00141394;
            goto LAB_001414eb;
          }
          iVar7 = iVar7 + -1;
        } while (ptVar6->a_type != A_SEMI);
        iVar7 = -iVar7;
LAB_001414eb:
        if (1 < iVar7) {
          ptVar3 = atom_getsymbol(ptVar10 + 1);
          ptVar4 = gensym("restore");
          if (ptVar3 == ptVar4) {
            ptVar3 = atom_getsymbol(ptVar10);
            local_50 = local_50 - (uint)(ptVar3 == &s__X);
          }
          ptVar3 = atom_getsymbol(ptVar10 + 1);
          ptVar4 = gensym("canvas");
          if (ptVar3 == ptVar4) {
            ptVar3 = atom_getsymbol(ptVar10);
            local_50 = local_50 + (uint)(ptVar3 == &s__N);
          }
        }
        if (iVar5 - iVar7 < 0) {
          return 0;
        }
        iVar9 = iVar9 + iVar7;
        a = ptVar10;
        ptVar10 = ptVar10 + iVar7;
        iVar8 = iVar5;
        iVar5 = iVar5 - iVar7;
      } while (0 < local_50);
      goto LAB_00141394;
    }
  }
  iVar9 = 0;
LAB_00141394:
  if (iVar8 < 4) {
    return 0;
  }
  ptVar3 = atom_getsymbol(a);
  if (ptVar3 != &s__X) {
    return 0;
  }
  ptVar3 = atom_getsymbol(a + 1);
  ptVar4 = gensym("restore");
  if ((((ptVar4 != ptVar3) && (ptVar4 = gensym("obj"), ptVar4 != ptVar3)) &&
      (ptVar4 = gensym("msg"), ptVar4 != ptVar3)) &&
     (((ptVar4 = gensym("text"), ptVar4 != ptVar3 &&
       (ptVar4 = gensym("floatatom"), ptVar4 != ptVar3)) &&
      ((ptVar4 = gensym("listbox"), ptVar4 != ptVar3 &&
       (ptVar4 = gensym("symbolatom"), ptVar4 != ptVar3)))))) {
    return 0;
  }
  if (x0 != (int *)0x0) {
    tVar12 = atom_getfloat(a + 2);
    *x0 = (int)tVar12;
  }
  if (y0 != (int *)0x0) {
    tVar12 = atom_getfloat(a + 3);
    *y0 = (int)tVar12;
  }
  if (type != (t_symbol **)0x0) {
    *type = ptVar3;
  }
  iVar5 = iVar9 + iVar8;
  do {
    bVar11 = iVar8 == 0;
    iVar8 = iVar8 + -1;
    iVar7 = iVar5;
    if (bVar11) break;
    iVar9 = iVar9 + 1;
    ptVar1 = &a->a_type;
    a = a + 1;
    iVar7 = iVar9;
  } while (*ptVar1 != A_SEMI);
  return (iVar7 < iVar2) + 1;
}

Assistant:

static int binbuf_getpos(t_binbuf*b, int *x0, int *y0, t_symbol**type)
{
        /*
         * checks how many objects the binbuf contains and where they are located
         * for simplicity, we stop after the first object...
         * "objects" are any patchable things
         * returns: 0: no objects/...
         *          1: single object in binbuf
         *          2: more than one object in binbuf
         * (x0,y0) are the coordinates of the first object
         * (type) is the type of the first object ("obj", "msg",...)
         */
    t_atom*argv = binbuf_getvec(b);
    int argc = binbuf_getnatom(b);
    const int argc0 = argc;
    int count = 0;
    t_symbol*s;
        /* get the position of the first object in the argv binbuf */
    if(argc > 2
       && atom_getsymbol(argv+0) == &s__N
       && atom_getsymbol(argv+1) == gensym("canvas"))
    {
        int ac = argc;
        t_atom*ap = argv;
        int stack = 0;
        do {
            int off = binbuf_nextmess(argc, argv);
            if(!off)
                break;
            ac = argc;
            ap = argv;
            argc-=off;
            argv+=off;
            count+=off;
            if(off >= 2)
            {
                if (atom_getsymbol(ap+1) == gensym("restore")
                    && atom_getsymbol(ap) == &s__X)
                    {
                        stack--;
                    }
                if (atom_getsymbol(ap+1) == gensym("canvas")
                    && atom_getsymbol(ap) == &s__N)
                    {
                        stack++;
                    }
            }
            if(argc<0)
                return 0;
        } while (stack>0);
        argc = ac;
        argv = ap;
    }
    if(argc < 4 || atom_getsymbol(argv) != &s__X)
        return 0;
        /* #X obj|msg|text|floatatom|symbolatom <x> <y> ...
         * TODO: subpatches #N canvas + #X restore <x> <y>
         */
    s = atom_getsymbol(argv+1);
    if(gensym("restore") == s
       || gensym("obj") == s
       || gensym("msg") == s
       || gensym("text") == s
       || gensym("floatatom") == s
       || gensym("listbox") == s
       || gensym("symbolatom") == s)
    {
        if(x0)*x0=atom_getfloat(argv+2);
        if(y0)*y0=atom_getfloat(argv+3);
        if(type)*type=s;
    } else
        return 0;

        /* no wind the binbuf to the next message */
    while(argc--)
    {
        count++;
        if (A_SEMI == argv->a_type)
            break;
        argv++;
    }
    return 1+(argc0 > count);
}